

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelIdentifier.cpp
# Opt level: O2

bool __thiscall csm::MIDescription::inRange(MIDescription *this,ModelIdentifier *id)

{
  bool bVar1;
  const_iterator cVar2;
  _Base_ptr p_Var3;
  
  if ((id->theComponents)._M_t._M_impl.super__Rb_tree_header._M_node_count <
      (this->theDescriptions)._M_t._M_impl.super__Rb_tree_header._M_node_count) {
    bVar1 = false;
  }
  else {
    p_Var3 = (this->theDescriptions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    bVar1 = true;
    while (((_Rb_tree_header *)p_Var3 != &(this->theDescriptions)._M_t._M_impl.super__Rb_tree_header
           && (bVar1 != false))) {
      cVar2 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_csm::MIC::Data>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_csm::MIC::Data>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_csm::MIC::Data>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_csm::MIC::Data>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_csm::MIC::Data>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_csm::MIC::Data>_>_>
                      *)id,(key_type *)(p_Var3 + 1));
      if ((_Rb_tree_header *)cVar2._M_node ==
          &(id->theComponents)._M_t._M_impl.super__Rb_tree_header) {
        bVar1 = false;
      }
      else {
        bVar1 = MIC::RangeList::contains((RangeList *)(p_Var3 + 2),(Data *)(cVar2._M_node + 2));
      }
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    }
  }
  return bVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& os,const RangeList::Range& range)
{
   os << (range.minInclusive() ? "[" : "(")
      << range.minimum()
      << ","
      << range.maximum()
      << (range.maxInclusive() ? "]" : ")");
   
   Data::Type rtype = range.minimum().type();
   
   if (rtype == Data::INT_TYPE)
   {
      if (range.step().intValue() > 1)
      {
         os << " (step " << range.step() << ")";
      }
   }
   else if (rtype == Data::DOUBLE_TYPE)
   {
      if (range.step().dblValue() != 0.0)
      {
         os << " (step " << range.step() << ")";
      }
   }
   
   return os;
}